

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O1

void __thiscall Downloader::openDownload(Downloader *this)

{
  QArrayData *local_40 [3];
  QUrl local_28 [3];
  
  if ((this->m_fileName).d.size == 0) {
    QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x119c27);
    QMetaObject::tr((char *)local_28,(char *)&staticMetaObject,0x119c2d);
    QMessageBox::critical(this,local_40,local_28,0x200000,0);
    if ((QArrayData *)local_28[0].d != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_28[0].d = *(int *)local_28[0].d + -1;
      UNLOCK();
      if (*(int *)local_28[0].d == 0) {
        QArrayData::deallocate((QArrayData *)local_28[0].d,2,8);
      }
    }
  }
  else {
    QDir::filePath((QString *)local_40);
    QUrl::fromLocalFile((QString *)local_28);
    QDesktopServices::openUrl(local_28);
    QUrl::~QUrl(local_28);
  }
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  return;
}

Assistant:

void Downloader::openDownload()
{
   if (!m_fileName.isEmpty())
      QDesktopServices::openUrl(QUrl::fromLocalFile(m_downloadDir.filePath(m_fileName)));

   else
   {
      QMessageBox::critical(this, tr("Error"), tr("Cannot find downloaded update!"), QMessageBox::Close);
   }
}